

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O1

string * __thiscall
MinVR::VRDisplayNode::printNode
          (string *__return_storage_ptr__,VRDisplayNode *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *valuesSet,string *prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar2;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *plVar3;
  _Base_ptr p_Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pcVar6;
  VRDisplayNode *this_00;
  long *plVar7;
  undefined8 *puVar8;
  iterator iVar9;
  ulong *puVar10;
  size_type *psVar11;
  _List_node_base *p_Var12;
  pointer ppVVar13;
  undefined8 uVar14;
  ulong uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string *out;
  string newPrefix;
  string name;
  ulong *local_140;
  long local_138;
  ulong local_130;
  long lStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  VRDisplayNode *local_b0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  local_100 = __return_storage_ptr__;
  local_b0 = this;
  local_a8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)valuesSet;
  if ((this->_name)._M_string_length < 0x31) {
    std::__cxx11::string::_M_assign((string *)&local_a0);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_120,(ulong)&this->_name);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_130 = *puVar10;
      lStack_128 = plVar7[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *puVar10;
      local_140 = (ulong *)*plVar7;
    }
    local_138 = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)&this->_name);
    uVar15 = 0xf;
    if (local_140 != &local_130) {
      uVar15 = local_130;
    }
    if (uVar15 < local_d0._M_string_length + local_138) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar14 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_d0._M_string_length + local_138) goto LAB_00144209;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_140);
    }
    else {
LAB_00144209:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_d0._M_dataplus._M_p);
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_f8.field_2._M_allocated_capacity = *psVar11;
      local_f8.field_2._8_8_ = puVar8[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar11;
      local_f8._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_f8._M_string_length = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)psVar11 = 0;
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_100->field_2;
  (local_100->_M_dataplus)._M_p = (pointer)paVar1;
  local_100->_M_string_length = 0;
  (local_100->field_2)._M_local_buf[0] = '\0';
  if (prefix->_M_string_length != 0) {
    std::__cxx11::string::_M_replace((ulong)local_100,0,(char *)0x0,0x15eb5e);
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  pcVar6 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_120);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_a0);
  local_140 = &local_130;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_130 = *puVar10;
    lStack_128 = plVar7[3];
  }
  else {
    local_130 = *puVar10;
    local_140 = (ulong *)*plVar7;
  }
  local_138 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  paVar5 = &local_f8.field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_f8.field_2._M_allocated_capacity = *psVar11;
    local_f8.field_2._8_8_ = plVar7[3];
    local_f8._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar11;
    local_f8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_f8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar5) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = (prefix->_M_dataplus)._M_p;
  local_f8._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_f8);
  std::operator+(&local_d0,"\n",&local_f8);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_120.field_2._M_allocated_capacity = *puVar10;
    local_120.field_2._8_8_ = plVar7[3];
  }
  else {
    local_120.field_2._M_allocated_capacity = *puVar10;
    local_120._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_120._M_string_length = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (*local_b0->_vptr_VRDisplayNode[3])(&local_80);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    uVar14 = local_120.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_78 + local_120._M_string_length) {
    uVar15 = 0xf;
    if (local_80 != local_70) {
      uVar15 = local_70[0];
    }
    if (local_78 + local_120._M_string_length <= uVar15) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_80,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
      goto LAB_0014458c;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_80);
LAB_0014458c:
  local_140 = &local_130;
  puVar10 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar10) {
    local_130 = *puVar10;
    lStack_128 = puVar8[3];
  }
  else {
    local_130 = *puVar10;
    local_140 = (ulong *)*puVar8;
  }
  local_138 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  std::__cxx11::string::_M_append((char *)local_100,(ulong)local_140);
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_120,"\n",&local_f8);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
  local_140 = &local_130;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_130 = *puVar10;
    lStack_128 = plVar7[3];
  }
  else {
    local_130 = *puVar10;
    local_140 = (ulong *)*plVar7;
  }
  local_138 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_100,(ulong)local_140);
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  local_d8 = paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  plVar2 = &local_b0->_valuesAdded;
  p_Var12 = (_List_node_base *)plVar2;
  while (p_Var12 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var12 != (_List_node_base *)plVar2) {
    std::operator+(&local_d0,"\n",&local_f8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    puVar10 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_120.field_2._M_allocated_capacity = *puVar10;
      local_120.field_2._8_8_ = plVar7[3];
    }
    else {
      local_120.field_2._M_allocated_capacity = *puVar10;
      local_120._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_120._M_string_length = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)p_Var12[1]._M_next);
    local_140 = &local_130;
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_130 = *puVar10;
      lStack_128 = plVar7[3];
    }
    else {
      local_130 = *puVar10;
      local_140 = (ulong *)*plVar7;
    }
    local_138 = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_100,(ulong)local_140);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              (local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (p_Var12 + 1));
  }
  if ((plVar2->
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)plVar2) {
    std::operator+(&local_120,"\n",&local_f8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_130 = *puVar10;
      lStack_128 = plVar7[3];
    }
    else {
      local_130 = *puVar10;
      local_140 = (ulong *)*plVar7;
    }
    local_138 = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_100,(ulong)local_140);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_120,"\n",&local_f8);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
  local_140 = &local_130;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_130 = *puVar10;
    lStack_128 = plVar7[3];
  }
  else {
    local_130 = *puVar10;
    local_140 = (ulong *)*plVar7;
  }
  local_138 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_100,(ulong)local_140);
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  plVar3 = &local_b0->_valuesNeeded;
  p_Var12 = (local_b0->_valuesNeeded).
            super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var12 != (_List_node_base *)plVar3) {
    p_Var4 = (_Base_ptr)(local_a8 + 8);
    do {
      std::operator+(&local_d0,"\n",&local_f8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_120.field_2._M_allocated_capacity = *puVar10;
        local_120.field_2._8_8_ = plVar7[3];
      }
      else {
        local_120.field_2._M_allocated_capacity = *puVar10;
        local_120._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_120._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)p_Var12[1]._M_next)
      ;
      local_140 = &local_130;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_130 = *puVar10;
        lStack_128 = plVar7[3];
      }
      else {
        local_130 = *puVar10;
        local_140 = (ulong *)*plVar7;
      }
      local_138 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_100,(ulong)local_140);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)local_100);
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a8,(key_type *)(p_Var12 + 1));
      if (iVar9._M_node == p_Var4) {
        std::__cxx11::string::append((char *)local_100);
      }
      p_Var12 = p_Var12->_M_next;
    } while (p_Var12 != (_List_node_base *)plVar3);
  }
  if ((plVar3->
      super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)plVar3) {
    std::operator+(&local_120,"\n",&local_f8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_130 = *puVar10;
      lStack_128 = plVar7[3];
    }
    else {
      local_130 = *puVar10;
      local_140 = (ulong *)*plVar7;
    }
    local_138 = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_100,(ulong)local_140);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
  ppVVar13 = (local_b0->_children).
             super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppVVar13 !=
      (local_b0->_children).
      super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppVVar13;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(&local_60,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      printNode(&local_120,this_00,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_60,&local_f8);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x15eb5e);
      local_140 = &local_130;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_130 = *puVar10;
        lStack_128 = plVar7[3];
      }
      else {
        local_130 = *puVar10;
        local_140 = (ulong *)*plVar7;
      }
      local_138 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_100,(ulong)local_140);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_60);
      ppVVar13 = ppVVar13 + 1;
    } while (ppVVar13 !=
             (local_b0->_children).
             super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return local_100;
}

Assistant:

std::string VRDisplayNode::printNode(std::set<std::string> valuesSet,
                                     const std::string &prefix) const {

  // First compress the long names a little bit for readability.
  std::string name;
  if (_name.size() > 48) {
    name = _name.substr(0,8) + "..." +
      _name.substr(_name.size() - 40, std::string::npos);

  } else {
    name = _name;
  }

  // Establish the output.
  std::string out;
  if (!prefix.empty()) out = "\n";

  // Display this node.
  out = prefix + "<displayNode:" + name + ">";

  // The lines following need a longer prefix.
  std::string newPrefix = prefix + " | ";

  out += "\n" + newPrefix + "  Type: " + getType();

  // Print the values added, but also add them to the set of values we
  // know from above this position in the display graph.
  out += "\n" + newPrefix + "  Values Added:";
  for (std::list<std::string>::const_iterator it = _valuesAdded.begin();
       it != _valuesAdded.end(); it++) {
    // Print the value added.
    out += "\n" + newPrefix + "    " + *it;

    // Insert it added value into the set from above.
    valuesSet.insert(*it);
  }
  if (_valuesAdded.empty()) out += "\n" + newPrefix + "     <none>";

  // Print the values needed, but also check them against the values already set.
  out += "\n" + newPrefix + "  Values Needed:";
  for (std::list<std::pair<std::string, bool> >::const_iterator it = _valuesNeeded.begin();
       it != _valuesNeeded.end(); it++) {
    out += "\n" + newPrefix + "    " + it->first;
    if (it->second) {
      out += " (required)";
    } else {
      out += " (optional)";
    }

    // If the name is not in the value set, flag it.
    if (valuesSet.find(it->first) == valuesSet.end()) {

      out += " <-- ERROR: this value will not be found.";
    }
  }
  if (_valuesNeeded.empty()) out += "\n" + newPrefix + "     <none>";

  // Recursively print the children nodes.
  for (std::vector<VRDisplayNode*>::const_iterator it = _children.begin();
       it != _children.end(); it++) {
    out += "\n" + (*it)->printNode(valuesSet, newPrefix);
  }

  return out;
}